

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timTime.c
# Opt level: O0

float Tim_ManGetCiArrival(Tim_Man_t *p,int iCi)

{
  int iVar1;
  Tim_Obj_t *pTVar2;
  Tim_Box_t *pBox_00;
  float *pfVar3;
  long lVar4;
  bool bVar5;
  int local_5c;
  int local_58;
  int k;
  int i;
  float DelayBest;
  float *pDelays;
  float *pTable;
  Tim_Obj_t *pObjRes;
  Tim_Obj_t *pObj;
  Tim_Obj_t *pObjThis;
  Tim_Box_t *pBox;
  int iCi_local;
  Tim_Man_t *p_local;
  
  pTVar2 = Tim_ManCi(p,iCi);
  if ((p->fUseTravId == 0) || (pTVar2->TravId != p->nTravIds)) {
    pTVar2->TravId = p->nTravIds;
    pBox_00 = Tim_ManCiBox(p,iCi);
    if (pBox_00 == (Tim_Box_t *)0x0) {
      p_local._4_4_ = pTVar2->timeArr;
    }
    else {
      pBox_00->TravId = p->nTravIds;
      if (p->fUseTravId != 0) {
        local_58 = 0;
        while( true ) {
          bVar5 = false;
          if (local_58 < pBox_00->nInputs) {
            pObjRes = Tim_ManBoxInput(p,pBox_00,local_58);
            bVar5 = pObjRes != (Tim_Obj_t *)0x0;
          }
          if (!bVar5) break;
          if (pObjRes->TravId != p->nTravIds) {
            printf("Tim_ManGetCiArrival(): Input arrival times of the box are not up to date!\n");
          }
          local_58 = local_58 + 1;
        }
      }
      pfVar3 = Tim_ManBoxDelayTable(p,pBox_00->iBox);
      local_58 = 0;
      while( true ) {
        bVar5 = false;
        if (local_58 < pBox_00->nOutputs) {
          pTable = (float *)Tim_ManBoxOutput(p,pBox_00,local_58);
          bVar5 = (Tim_Obj_t *)pTable != (Tim_Obj_t *)0x0;
        }
        if (!bVar5) break;
        lVar4 = (long)(local_58 * pBox_00->nInputs);
        k = -0x319194d8;
        local_5c = 0;
        while( true ) {
          bVar5 = false;
          if (local_5c < pBox_00->nInputs) {
            pObjRes = Tim_ManBoxInput(p,pBox_00,local_5c);
            bVar5 = pObjRes != (Tim_Obj_t *)0x0;
          }
          if (!bVar5) break;
          if ((pfVar3[lVar4 + (long)local_5c + 3] != -1e+09) ||
             (NAN(pfVar3[lVar4 + (long)local_5c + 3]))) {
            iVar1 = Abc_MaxInt((int)(float)k,
                               (int)(pObjRes->timeArr + pfVar3[lVar4 + (long)local_5c + 3]));
            k = (int)(float)iVar1;
          }
          local_5c = local_5c + 1;
        }
        pTable[4] = (float)k;
        pTable[1] = (float)p->nTravIds;
        local_58 = local_58 + 1;
      }
      p_local._4_4_ = pTVar2->timeArr;
    }
  }
  else {
    p_local._4_4_ = pTVar2->timeArr;
  }
  return p_local._4_4_;
}

Assistant:

float Tim_ManGetCiArrival( Tim_Man_t * p, int iCi )
{
    Tim_Box_t * pBox;
    Tim_Obj_t * pObjThis, * pObj, * pObjRes;
    float * pTable, * pDelays, DelayBest;
    int i, k;
    // consider the already processed PI
    pObjThis = Tim_ManCi( p, iCi );
    if ( p->fUseTravId && pObjThis->TravId == p->nTravIds )
        return pObjThis->timeArr;
    pObjThis->TravId = p->nTravIds;
    // consider the main PI
    pBox = Tim_ManCiBox( p, iCi );
    if ( pBox == NULL )
        return pObjThis->timeArr;
    // update box timing
    pBox->TravId = p->nTravIds;
    // get the arrival times of the inputs of the box (POs)
    if ( p->fUseTravId )
    Tim_ManBoxForEachInput( p, pBox, pObj, i )
        if ( pObj->TravId != p->nTravIds )
            printf( "Tim_ManGetCiArrival(): Input arrival times of the box are not up to date!\n" );
    // compute the arrival times for each output of the box (PIs)
    pTable = Tim_ManBoxDelayTable( p, pBox->iBox );
    Tim_ManBoxForEachOutput( p, pBox, pObjRes, i )
    {
        pDelays = pTable + 3 + i * pBox->nInputs;
        DelayBest = -TIM_ETERNITY;
        Tim_ManBoxForEachInput( p, pBox, pObj, k )
			if ( pDelays[k] != -ABC_INFINITY )
				DelayBest = Abc_MaxInt( DelayBest, pObj->timeArr + pDelays[k] );
        pObjRes->timeArr = DelayBest;
        pObjRes->TravId = p->nTravIds;
    }
    return pObjThis->timeArr;
}